

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,
                         EncodingResult<kj::Array<char16_t>_> *param_3,undefined8 param_4,
                         StringPtr *param_5)

{
  Delimited<kj::ArrayPtr<const_char16_t>_> *params;
  ArrayPtr<const_char> local_68;
  Delimited<kj::ArrayPtr<const_char16_t>_> local_58;
  undefined8 *local_20;
  DebugComparison<kj::EncodingResult<kj::Array<char16_t>_>_&,_const_kj::None_&> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  tryToCharSequence<kj::EncodingResult<kj::Array<char16_t>>,kj::_::Delimited<kj::ArrayPtr<char16_t_const>>>
            (&local_58,(_ *)*param_2,param_3);
  params = (Delimited<kj::ArrayPtr<const_char16_t>_> *)(local_20 + 2);
  local_68 = (ArrayPtr<const_char>)tryToCharSequence(local_20[1]);
  concat<kj::_::Delimited<kj::ArrayPtr<char16_t_const>>,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_58,params,(StringPtr *)&local_68,param_5);
  Delimited<kj::ArrayPtr<const_char16_t>_>::~Delimited(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}